

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_format_gnutar_header(archive_write *a,char *h,archive_entry *entry,int tartype)

{
  long lVar1;
  mode_t mVar2;
  int iVar3;
  size_t sVar4;
  int64_t iVar5;
  time_t v;
  dev_t dVar6;
  int in_ECX;
  archive_entry *in_RDX;
  void *in_RSI;
  archive *in_RDI;
  gnutar *gnutar;
  char *p;
  size_t copy_length;
  int ret;
  int i;
  uint checksum;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  archive *in_stack_ffffffffffffffb0;
  archive *in_stack_ffffffffffffffb8;
  char *local_38;
  size_t local_30;
  int local_28;
  int local_24;
  uint local_20;
  
  lVar1 = *(long *)&in_RDI[1].current_codepage;
  local_28 = 0;
  memcpy(in_RSI,"",0x200);
  if ((in_ECX == 0x4b) || (in_ECX == 0x4c)) {
    local_38 = archive_entry_pathname
                         ((archive_entry *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_30 = strlen(local_38);
  }
  else {
    local_38 = *(char **)(lVar1 + 0x20);
    local_30 = *(ulong *)(lVar1 + 0x28);
  }
  if (100 < local_30) {
    local_30 = 100;
  }
  memcpy(in_RSI,local_38,local_30);
  local_30 = *(ulong *)(lVar1 + 0x18);
  if (local_30 != 0) {
    if (100 < local_30) {
      local_30 = 100;
    }
    memcpy((void *)((long)in_RSI + 0x9d),*(void **)(lVar1 + 0x10),local_30);
  }
  if ((in_ECX == 0x4b) || (in_ECX == 0x4c)) {
    local_38 = archive_entry_uname((archive_entry *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_30 = strlen(local_38);
  }
  else {
    local_38 = *(char **)(lVar1 + 0x30);
    local_30 = *(ulong *)(lVar1 + 0x38);
  }
  if (local_30 != 0) {
    if (0x20 < local_30) {
      local_30 = 0x20;
    }
    memcpy((void *)((long)in_RSI + 0x109),local_38,local_30);
  }
  if ((in_ECX == 0x4b) || (in_ECX == 0x4c)) {
    local_38 = archive_entry_gname((archive_entry *)
                                   CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    local_30 = strlen(local_38);
  }
  else {
    local_38 = *(char **)(lVar1 + 0x40);
    local_30 = *(size_t *)(lVar1 + 0x48);
  }
  if (local_30 != 0) {
    sVar4 = strlen(local_38);
    if (0x20 < sVar4) {
      local_30 = 0x20;
    }
    memcpy((void *)((long)in_RSI + 0x129),local_38,local_30);
  }
  mVar2 = archive_entry_mode(in_RDX);
  format_octal((ulong)(mVar2 & 0xfff),(char *)((long)in_RSI + 100),7);
  iVar5 = archive_entry_uid(in_RDX);
  iVar3 = format_octal(iVar5,(char *)((long)in_RSI + 0x6c),7);
  if (iVar3 != 0) {
    in_stack_ffffffffffffffb8 = in_RDI;
    iVar5 = archive_entry_uid(in_RDX);
    archive_set_error(in_stack_ffffffffffffffb8,0x22,"Numeric user ID %jd too large",iVar5);
    local_28 = -0x19;
  }
  iVar5 = archive_entry_gid(in_RDX);
  iVar3 = format_octal(iVar5,(char *)((long)in_RSI + 0x74),7);
  if (iVar3 != 0) {
    in_stack_ffffffffffffffb0 = in_RDI;
    iVar5 = archive_entry_gid(in_RDX);
    archive_set_error(in_stack_ffffffffffffffb0,0x22,"Numeric group ID %jd too large",iVar5);
    local_28 = -0x19;
  }
  archive_entry_size(in_RDX);
  iVar3 = format_number((int64_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
  if (iVar3 != 0) {
    archive_set_error(in_RDI,0x22,"File size out of range");
    local_28 = -0x19;
  }
  v = archive_entry_mtime(in_RDX);
  format_octal(v,(char *)((long)in_RSI + 0x88),0xb);
  mVar2 = archive_entry_filetype(in_RDX);
  if ((mVar2 == 0x6000) || (mVar2 = archive_entry_filetype(in_RDX), mVar2 == 0x2000)) {
    dVar6 = archive_entry_rdevmajor
                      ((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar3 = format_octal(dVar6,(char *)((long)in_RSI + 0x149),6);
    if (iVar3 != 0) {
      archive_set_error(in_RDI,0x22,"Major device number too large");
      local_28 = -0x19;
    }
    dVar6 = archive_entry_rdevminor
                      ((archive_entry *)
                       CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar3 = format_octal(dVar6,(char *)((long)in_RSI + 0x151),6);
    if (iVar3 != 0) {
      archive_set_error(in_RDI,0x22,"Minor device number too large");
      local_28 = -0x19;
    }
  }
  *(char *)((long)in_RSI + 0x9c) = (char)in_ECX;
  local_20 = 0;
  for (local_24 = 0; local_24 < 0x200; local_24 = local_24 + 1) {
    local_20 = *(byte *)((long)in_RSI + (long)local_24) + local_20;
  }
  *(undefined1 *)((long)in_RSI + 0x9a) = 0;
  format_octal((ulong)local_20,(char *)((long)in_RSI + 0x94),6);
  return local_28;
}

Assistant:

static int
archive_format_gnutar_header(struct archive_write *a, char h[512],
    struct archive_entry *entry, int tartype)
{
	unsigned int checksum;
	int i, ret;
	size_t copy_length;
	const char *p;
	struct gnutar *gnutar;

	gnutar = (struct gnutar *)a->format_data;

	ret = 0;

	/*
	 * The "template header" already includes the signature,
	 * various end-of-field markers, and other required elements.
	 */
	memcpy(h, &template_header, 512);

	/*
	 * Because the block is already null-filled, and strings
	 * are allowed to exactly fill their destination (without null),
	 * I use memcpy(dest, src, strlen()) here a lot to copy strings.
	 */

	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_pathname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->pathname;
		copy_length = gnutar->pathname_length;
	}
	if (copy_length > GNUTAR_name_size)
		copy_length = GNUTAR_name_size;
	memcpy(h + GNUTAR_name_offset, p, copy_length);

	if ((copy_length = gnutar->linkname_length) > 0) {
		if (copy_length > GNUTAR_linkname_size)
			copy_length = GNUTAR_linkname_size;
		memcpy(h + GNUTAR_linkname_offset, gnutar->linkname,
		    copy_length);
	}

	/* TODO: How does GNU tar handle unames longer than GNUTAR_uname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_uname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->uname;
		copy_length = gnutar->uname_length;
	}
	if (copy_length > 0) {
		if (copy_length > GNUTAR_uname_size)
			copy_length = GNUTAR_uname_size;
		memcpy(h + GNUTAR_uname_offset, p, copy_length);
	}

	/* TODO: How does GNU tar handle gnames longer than GNUTAR_gname_size? */
	if (tartype == 'K' || tartype == 'L') {
		p = archive_entry_gname(entry);
		copy_length = strlen(p);
	} else {
		p = gnutar->gname;
		copy_length = gnutar->gname_length;
	}
	if (copy_length > 0) {
		if (strlen(p) > GNUTAR_gname_size)
			copy_length = GNUTAR_gname_size;
		memcpy(h + GNUTAR_gname_offset, p, copy_length);
	}

	/* By truncating the mode here, we ensure it always fits. */
	format_octal(archive_entry_mode(entry) & 07777,
	    h + GNUTAR_mode_offset, GNUTAR_mode_size);

	/* TODO: How does GNU tar handle large UIDs? */
	if (format_octal(archive_entry_uid(entry),
	    h + GNUTAR_uid_offset, GNUTAR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID %jd too large",
		    (intmax_t)archive_entry_uid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* TODO: How does GNU tar handle large GIDs? */
	if (format_octal(archive_entry_gid(entry),
	    h + GNUTAR_gid_offset, GNUTAR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID %jd too large",
		    (intmax_t)archive_entry_gid(entry));
		ret = ARCHIVE_FAILED;
	}

	/* GNU tar supports base-256 here, so should never overflow. */
	if (format_number(archive_entry_size(entry), h + GNUTAR_size_offset,
		GNUTAR_size_size, GNUTAR_size_max_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		ret = ARCHIVE_FAILED;
	}

	/* Shouldn't overflow before 2106, since mtime field is 33 bits. */
	format_octal(archive_entry_mtime(entry),
	    h + GNUTAR_mtime_offset, GNUTAR_mtime_size);

	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
		if (format_octal(archive_entry_rdevmajor(entry),
		    h + GNUTAR_rdevmajor_offset,
			GNUTAR_rdevmajor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Major device number too large");
			ret = ARCHIVE_FAILED;
		}

		if (format_octal(archive_entry_rdevminor(entry),
		    h + GNUTAR_rdevminor_offset,
			GNUTAR_rdevminor_size)) {
			archive_set_error(&a->archive, ERANGE,
			    "Minor device number too large");
			ret = ARCHIVE_FAILED;
		}
	}

	h[GNUTAR_typeflag_offset] = tartype;

	checksum = 0;
	for (i = 0; i < 512; i++)
		checksum += 255 & (unsigned int)h[i];
	h[GNUTAR_checksum_offset + 6] = '\0'; /* Can't be pre-set in the template. */
	/* h[GNUTAR_checksum_offset + 7] = ' '; */ /* This is pre-set in the template. */
	format_octal(checksum, h + GNUTAR_checksum_offset, 6);
	return (ret);
}